

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_twod_analytic_node(REF_NODE ref_node,char *version)

{
  REF_DBL *pRVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined8 uVar9;
  REF_INT node;
  long lVar10;
  ulong uVar11;
  long lVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Dd_00;
  double dVar15;
  REF_DBL m [6];
  uint local_124;
  double local_118;
  double local_110;
  undefined1 local_108 [16];
  undefined1 local_e8 [16];
  double local_c8;
  double local_c0;
  undefined8 local_b8;
  double local_b0;
  double local_a8;
  undefined8 local_a0;
  double local_98;
  double local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  REF_DBL local_68 [7];
  
  if (0 < ref_node->max) {
    lVar12 = 0;
    lVar10 = 0;
    bVar6 = false;
    local_110 = 0.0;
    local_118 = 0.0;
    local_108 = ZEXT816(0x3ff0000000000000);
    local_e8 = ZEXT816(0x3ff0000000000000);
    do {
      if (-1 < ref_node->global[lVar10]) {
        iVar7 = strcmp(version,"larsson1");
        node = (REF_INT)lVar10;
        if (iVar7 == 0) {
          local_110 = *(double *)((long)ref_node->real + lVar12);
          local_118 = *(double *)((long)ref_node->real + lVar12 + 8);
          dVar15 = sin(local_110 * 6.28318530717958);
          dVar5 = sin(local_118 * 6.28318530717958);
          dVar3 = sin(local_110 * 6.28318530717958);
          dVar4 = sin(local_118 * 6.28318530717958);
          uVar8 = ref_node_metric_form
                            (ref_node,node,dVar5 * dVar15 * 200.0 + 400.0,0.0,0.0,
                             dVar3 * -200.0 * dVar4 + 400.0,0.0,1.0);
          uVar11 = (ulong)uVar8;
          if (uVar8 != 0) {
            uVar9 = 0x94;
LAB_001e2b95:
            local_124 = (uint)uVar11;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,uVar9,"ref_metric_twod_analytic_node",uVar11,"set node met");
          }
LAB_001e2bb2:
          uVar8 = (uint)uVar11;
          bVar6 = true;
        }
        else {
          iVar7 = strcmp(version,"larsson2");
          if (iVar7 == 0) {
            local_110 = *(double *)((long)ref_node->real + lVar12);
            local_118 = *(double *)((long)ref_node->real + lVar12 + 8);
            dVar15 = pow(local_118 * 0.05 + 0.05,-2.0);
            dVar5 = pow(local_118 * 0.12 + 0.04,-2.0);
            uVar8 = ref_node_metric_form(ref_node,node,dVar15,0.0,0.0,dVar5,0.0,1.0);
            uVar11 = (ulong)uVar8;
            if (uVar8 != 0) {
              uVar9 = 0xa0;
              goto LAB_001e2b95;
            }
            goto LAB_001e2bb2;
          }
          iVar7 = strcmp(version,"iso01");
          if (iVar7 == 0) {
            uVar8 = ref_node_metric_form
                              (ref_node,node,99.99999999999999,0.0,0.0,99.99999999999999,0.0,1.0);
            uVar11 = (ulong)uVar8;
            if (uVar8 != 0) {
              uVar9 = 0xa8;
              goto LAB_001e2b95;
            }
            goto LAB_001e2bb2;
          }
          iVar7 = strcmp(version,"isorad");
          if (iVar7 == 0) {
            pRVar1 = ref_node->real;
            dVar15 = *(double *)((long)pRVar1 + lVar12 + 8);
            dVar5 = *(double *)((long)pRVar1 + lVar12 + 0x10);
            dVar15 = dVar5 * dVar5 +
                     dVar15 * dVar15 +
                     *(double *)((long)pRVar1 + lVar12) * *(double *)((long)pRVar1 + lVar12);
            if (dVar15 < 0.0) {
              dVar15 = sqrt(dVar15);
            }
            else {
              dVar15 = SQRT(dVar15);
            }
            dVar15 = dVar15 * 0.1 + 0.1;
            dVar15 = 1.0 / (dVar15 * dVar15);
            uVar8 = ref_node_metric_form(ref_node,node,dVar15,0.0,0.0,dVar15,0.0,1.0);
            uVar11 = (ulong)uVar8;
            if (uVar8 != 0) {
              uVar9 = 0xb3;
              goto LAB_001e2b95;
            }
            goto LAB_001e2bb2;
          }
          iVar7 = strcmp(version,"masabl-1");
          if (iVar7 == 0) {
            dVar15 = cos((*(double *)((long)ref_node->real + lVar12) + -0.5) * 3.14159265358979);
            dVar15 = dVar15 * 0.2 + 0.01;
            dVar5 = exp(*(double *)((long)ref_node->real + lVar12 + 8) * 6.0);
            uVar8 = ref_node_metric_form
                              (ref_node,node,1.0 / (dVar15 * dVar15),0.0,0.0,
                               1.0 / (dVar5 * 0.001 * dVar5 * 0.001),0.0,1.0);
            uVar11 = (ulong)uVar8;
            if (uVar8 != 0) {
              uVar9 = 0xbf;
              goto LAB_001e2b95;
            }
            goto LAB_001e2bb2;
          }
          iVar7 = strcmp(version,"side");
          if (iVar7 == 0) {
            dVar15 = *(double *)((long)ref_node->real + lVar12 + 8) * 0.09000000000000001 + 0.01;
            uVar8 = ref_node_metric_form
                              (ref_node,node,99.99999999999999,0.0,0.0,1.0 / (dVar15 * dVar15),0.0,
                               1.0);
            uVar11 = (ulong)uVar8;
            if (uVar8 != 0) {
              uVar9 = 0xc9;
              goto LAB_001e2b95;
            }
            goto LAB_001e2bb2;
          }
          iVar7 = strcmp(version,"linear-0001");
          if (iVar7 == 0) {
            dVar15 = *(double *)((long)ref_node->real + lVar12 + 8) + -0.5;
            if (dVar15 <= -dVar15) {
              dVar15 = -dVar15;
            }
            dVar15 = dVar15 * 0.0999 + dVar15 * 0.0999 + 0.0001;
            uVar8 = ref_node_metric_form
                              (ref_node,node,99.99999999999999,0.0,0.0,1.0 / (dVar15 * dVar15),0.0,
                               1.0);
            uVar11 = (ulong)uVar8;
            if (uVar8 != 0) {
              uVar9 = 0xd3;
              goto LAB_001e2b95;
            }
            goto LAB_001e2bb2;
          }
          iVar7 = strcmp(version,"linear-01");
          if (iVar7 == 0) {
            dVar15 = *(double *)((long)ref_node->real + lVar12 + 8) + -0.5;
            if (dVar15 <= -dVar15) {
              dVar15 = -dVar15;
            }
            dVar15 = dVar15 * 0.09000000000000001 + dVar15 * 0.09000000000000001 + 0.01;
            uVar8 = ref_node_metric_form
                              (ref_node,node,99.99999999999999,0.0,0.0,1.0 / (dVar15 * dVar15),0.0,
                               1.0);
            uVar11 = (ulong)uVar8;
            if (uVar8 != 0) {
              uVar9 = 0xdd;
              goto LAB_001e2b95;
            }
            goto LAB_001e2bb2;
          }
          iVar7 = strcmp(version,"polar-2");
          if (iVar7 == 0) {
            local_110 = *(double *)((long)ref_node->real + lVar12);
            local_108._8_4_ = 0;
            local_108._12_4_ = 0;
            local_118 = *(double *)((long)ref_node->real + lVar12 + 8);
            dVar15 = local_110 * local_110 + local_118 * local_118;
            if (dVar15 < 0.0) {
              dVar15 = sqrt(dVar15);
              local_108._8_4_ = extraout_XMM0_Dc;
              local_108._12_4_ = extraout_XMM0_Dd;
            }
            else {
              dVar15 = SQRT(dVar15);
            }
            dVar15 = dVar15 + -0.5;
            if (dVar15 <= -dVar15) {
              dVar15 = -dVar15;
            }
            local_e8._8_4_ = local_108._8_4_;
            local_e8._0_8_ = dVar15 * 0.198 + 0.001;
            local_e8._12_4_ = local_108._12_4_;
            dVar15 = dVar15 * 10.0;
            if (1.0 <= dVar15) {
              dVar15 = 1.0;
            }
            local_108._0_8_ = dVar15 * 0.1 + (1.0 - dVar15) * 0.025;
            bVar6 = true;
          }
          iVar7 = strcmp(version,"radial-1");
          if (iVar7 == 0) {
            local_110 = *(double *)((long)ref_node->real + lVar12) + 0.5;
            local_118 = *(double *)((long)ref_node->real + lVar12 + 8) + -0.5;
            atan2(local_118,local_110);
            bVar6 = true;
            local_e8 = ZEXT816(0x3f847ae147ae147b);
            local_108 = ZEXT816(0x3fb999999999999a);
          }
          iVar7 = strcmp(version,"circle-1");
          if (iVar7 == 0) {
            uVar13 = 0;
            uVar14 = 0;
            local_110 = *(double *)((long)ref_node->real + lVar12) + 0.5;
            local_118 = *(double *)((long)ref_node->real + lVar12 + 8) + -0.5;
            dVar15 = local_110 * local_110 + local_118 * local_118;
            if (dVar15 < 0.0) {
              dVar15 = sqrt(dVar15);
              uVar13 = extraout_XMM0_Dc_00;
              uVar14 = extraout_XMM0_Dd_00;
            }
            else {
              dVar15 = SQRT(dVar15);
            }
            auVar2._8_4_ = uVar13;
            auVar2._0_8_ = dVar15;
            auVar2._12_4_ = uVar14;
            atan2(local_118,local_110);
            local_108._8_8_ = auVar2._8_8_;
            dVar5 = 1.0 - dVar15;
            if (dVar5 <= -dVar5) {
              dVar5 = -dVar5;
            }
            local_108._0_8_ = dVar15 * 0.1 + dVar5 * 1.5;
            local_e8._8_8_ = 0;
            local_e8._0_8_ = dVar5 * 1.5 + 0.0005;
            bVar6 = true;
          }
          dVar15 = atan2(local_118,local_110);
          local_c8 = 1.0 / ((double)local_e8._0_8_ * (double)local_e8._0_8_);
          local_c0 = 1.0 / ((double)local_108._0_8_ * (double)local_108._0_8_);
          local_b8 = 0x3ff0000000000000;
          local_b0 = cos(dVar15);
          local_a8 = sin(dVar15);
          local_a0 = 0;
          local_98 = sin(dVar15);
          local_98 = -local_98;
          local_90 = cos(dVar15);
          local_88 = 0;
          uStack_80 = 0;
          local_78 = 0;
          local_70 = 0x3ff0000000000000;
          ref_matrix_form_m(&local_c8,local_68);
          uVar8 = ref_node_metric_set(ref_node,node,local_68);
          if (uVar8 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x10d,"ref_metric_twod_analytic_node",(ulong)uVar8,"set node met");
            local_124 = uVar8;
          }
        }
        if (uVar8 != 0) {
          return local_124;
        }
      }
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + 0x78;
    } while (lVar10 < ref_node->max);
    if (bVar6) {
      return 0;
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x110,
         "ref_metric_twod_analytic_node","metric unknown");
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_metric_twod_analytic_node(REF_NODE ref_node,
                                                 const char *version) {
  REF_INT node;
  REF_DBL x = 0, y = 0, r, t;
  REF_DBL h_z = 1, h_t = 1, h_r = 1, h0, h, hh, hy, hx, c, k1, d0;
  REF_DBL d[12], m[6];
  REF_BOOL metric_recognized = REF_FALSE;

  each_ref_node_valid_node(ref_node, node) {
    if (strcmp(version, "larsson1") == 0) {
      REF_DBL c1 = 200.0;
      REF_DBL c2 = 200.0;
      REF_DBL m11;
      REF_DBL m22;
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      m11 =
          400.0 + c1 * sin(2.0 * ref_math_pi * x) * sin(2.0 * ref_math_pi * y);
      m22 =
          400.0 - c2 * sin(2.0 * ref_math_pi * x) * sin(2.0 * ref_math_pi * y);
      RSS(ref_node_metric_form(ref_node, node, m11, 0, 0, m22, 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "larsson2") == 0) {
      REF_DBL m11;
      REF_DBL m22;
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      m11 = pow(0.05 + 0.05 * y, -2);
      m22 = pow(0.04 + 0.12 * y, -2);
      RSS(ref_node_metric_form(ref_node, node, m11, 0, 0, m22, 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "iso01") == 0) {
      metric_recognized = REF_TRUE;
      h = 0.1;
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (h * h), 0, 0,
                               1.0 / (h * h), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "isorad") == 0) {
      metric_recognized = REF_TRUE;
      r = sqrt(pow(ref_node_xyz(ref_node, 0, node), 2) +
               pow(ref_node_xyz(ref_node, 1, node), 2) +
               pow(ref_node_xyz(ref_node, 2, node), 2));
      h = 0.1 + 0.1 * r;
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (h * h), 0, 0,
                               1.0 / (h * h), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "masabl-1") == 0) {
      metric_recognized = REF_TRUE;
      hx = 0.01 +
           0.2 * cos(ref_math_pi * (ref_node_xyz(ref_node, 0, node) - 0.5));
      c = 0.001;
      k1 = 6.0;
      hy = c * exp(k1 * ref_node_xyz(ref_node, 1, node));
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (hx * hx), 0, 0,
                               1.0 / (hy * hy), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "side") == 0) {
      metric_recognized = REF_TRUE;
      h0 = 0.1;
      h = 0.01;
      hh = h + (h0 - h) * ref_node_xyz(ref_node, 1, node);
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (0.1 * 0.1), 0, 0,
                               1.0 / (hh * hh), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "linear-0001") == 0) {
      metric_recognized = REF_TRUE;
      h0 = 0.1;
      h = 0.0001;
      hh = h + (0.1 - h) * ABS(ref_node_xyz(ref_node, 1, node) - 0.5) / 0.5;
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (0.1 * 0.1), 0, 0,
                               1.0 / (hh * hh), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "linear-01") == 0) {
      metric_recognized = REF_TRUE;
      h0 = 0.1;
      h = 0.01;
      hh = h + (0.1 - h) * ABS(ref_node_xyz(ref_node, 1, node) - 0.5) / 0.5;
      RSS(ref_node_metric_form(ref_node, node, 1.0 / (0.1 * 0.1), 0, 0,
                               1.0 / (hh * hh), 0, 1.0),
          "set node met");
      continue;
    }
    if (strcmp(version, "polar-2") == 0) {
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      r = sqrt(x * x + y * y);
      h_z = 1.0;
      h_t = 0.1;
      h0 = 0.001;
      h_r = h0 + 2 * (0.1 - h0) * ABS(r - 0.5);
      d0 = MIN(10.0 * ABS(r - 0.5), 1.0);
      h_t = 0.1 * d0 + 0.025 * (1.0 - d0);
    }
    if (strcmp(version, "radial-1") == 0) {
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node) + 0.5;
      y = ref_node_xyz(ref_node, 1, node) - 0.5;
      t = atan2(y, x);
      h_z = 1.0;
      h_t = 0.1;
      h_r = 0.01;
    }
    if (strcmp(version, "circle-1") == 0) {
      metric_recognized = REF_TRUE;
      x = ref_node_xyz(ref_node, 0, node) + 0.5;
      y = ref_node_xyz(ref_node, 1, node) - 0.5;
      r = sqrt(x * x + y * y);
      t = atan2(y, x);
      h_z = 1.0;
      h_r = 0.0005 + 1.5 * ABS(1.0 - r);
      h_t = 0.1 * r + 1.5 * ABS(1.0 - r);
    }
    t = atan2(y, x);
    ref_matrix_eig(d, 0) = 1.0 / (h_r * h_r);
    ref_matrix_eig(d, 1) = 1.0 / (h_t * h_t);
    ref_matrix_eig(d, 2) = 1.0 / (h_z * h_z);
    ref_matrix_vec(d, 0, 0) = cos(t);
    ref_matrix_vec(d, 1, 0) = sin(t);
    ref_matrix_vec(d, 2, 0) = 0.0;
    ref_matrix_vec(d, 0, 1) = -sin(t);
    ref_matrix_vec(d, 1, 1) = cos(t);
    ref_matrix_vec(d, 2, 1) = 0.0;
    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = 0.0;
    ref_matrix_vec(d, 2, 2) = 1.0;
    ref_matrix_form_m(d, m);
    RSS(ref_node_metric_set(ref_node, node, m), "set node met");
  }

  RAS(metric_recognized, "metric unknown");

  return REF_SUCCESS;
}